

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O0

String * Error::getErrorString(String *__return_storage_ptr__,uint error)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  Iterator *other;
  Str *this;
  char *s;
  usize length;
  char *errorMessage;
  Iterator local_30;
  Iterator it;
  uint32 threadId;
  uint error_local;
  String *errorStr;
  
  if (error == 0x10000) {
    String::String(__return_storage_ptr__);
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)&Private::mutex);
    if ((iVar3 != 0) &&
       (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Error.cpp"
                              ,0x77,"pthread_mutex_lock(&Private::mutex) == 0"), iVar3 != 0)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    lVar4 = syscall(0xba);
    it.item._0_4_ = (undefined4)lVar4;
    local_30 = Map<unsigned_int,_Error::Private::Str>::find(&Private::userErrorStrings,(uint *)&it);
    other = Map<unsigned_int,_Error::Private::Str>::end(&Private::userErrorStrings);
    bVar2 = Map<unsigned_int,_Error::Private::Str>::Iterator::operator!=(&local_30,other);
    if (bVar2) {
      this = Map<unsigned_int,_Error::Private::Str>::Iterator::operator*(&local_30);
      Private::Str::operator_cast_to_String((String *)&errorMessage,this);
      String::operator=(__return_storage_ptr__,(String *)&errorMessage);
      String::~String((String *)&errorMessage);
    }
    iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&Private::mutex);
    if ((iVar3 != 0) &&
       (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Error.cpp"
                              ,0x85,"pthread_mutex_unlock(&Private::mutex) == 0"), iVar3 != 0)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  else {
    s = strerror(error);
    length = String::length(s);
    String::String(__return_storage_ptr__,s,length);
  }
  return __return_storage_ptr__;
}

Assistant:

String Error::getErrorString(uint error)
{
  if(error == 0x10000)
  {
    String errorStr;
#ifdef _WIN32
    EnterCriticalSection(&Private::cs);
#else
    VERIFY(pthread_mutex_lock(&Private::mutex) == 0);
#endif

#ifdef _WIN32
    uint32 threadId = (uint32)GetCurrentThreadId();
#else
    uint32 threadId = (uint32)syscall(__NR_gettid);
#endif
    Map<uint32, Error::Private::Str>::Iterator it = Private::userErrorStrings.find(threadId);
    if(it != Private::userErrorStrings.end())
      errorStr = *it;
#ifdef _WIN32
    LeaveCriticalSection(&Private::cs);
#else
    VERIFY(pthread_mutex_unlock(&Private::mutex) == 0);
#endif
    return errorStr;
  }

#ifdef _WIN32
  TCHAR errorMessage[256];
  DWORD len = FormatMessage(
        FORMAT_MESSAGE_FROM_SYSTEM |
        FORMAT_MESSAGE_IGNORE_INSERTS,
        NULL,
        error,
        MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
        (LPTSTR) errorMessage,
        256, NULL );
  ASSERT(len >= 0 && len <= 256);
  while(len > 0 && String::isSpace(errorMessage[len - 1]))
    --len;
  errorMessage[len] = '\0';
  return String(errorMessage, len);
#else
  const char* errorMessage = strerror(error);
  return String(errorMessage, String::length(errorMessage));
#endif
}